

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  size_t sVar2;
  
  sVar2 = 0;
  for (lVar1 = 0; lVar1 != 0xd80; lVar1 = lVar1 + 0xd8) {
    __mutex = (pthread_mutex_t *)(this->shard_[0].lru_.key_data + lVar1 + -0x74);
    std::mutex::lock((mutex *)&__mutex->__data);
    sVar2 = sVar2 + *(long *)(this->shard_[0].lru_.key_data + lVar1 + -0x4c);
    pthread_mutex_unlock(__mutex);
  }
  return sVar2;
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }